

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PointCase::init(PointCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_45;
  float local_44;
  GLfloat pointSizeRange [2];
  string local_38;
  
  iVar1 = (*((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_44 = this->m_pointSize;
  pointSizeRange[0] = 0.0;
  pointSizeRange[1] = 0.0;
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x818))(0x846d,pointSizeRange);
  if (local_44 <= pointSizeRange[1]) {
    return iVar1;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Maximum point size is too low for this test",&local_45);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void PointCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	checkPointSize (gl, m_pointSize);
}